

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::NFRule::doParse
          (NFRule *this,UnicodeString *text,ParsePosition *parsePosition,UBool isFractionRule,
          double upperBound,uint32_t nonNumericalExecutedRuleMask,Formattable *resVal)

{
  undefined4 srcStart;
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int ei;
  bool bVar6;
  double dVar7;
  long local_238;
  int32_t local_1d4;
  int32_t local_1c8;
  int32_t i_temp_1;
  int32_t i_temp;
  ParsePosition pp2;
  UnicodeString workText2;
  double partialResult;
  UnicodeString temp;
  double tempBaseValue;
  double dStack_108;
  int start;
  double result;
  int highWaterMark;
  undefined1 local_f0 [4];
  int32_t prefixLength;
  UnicodeString prefix;
  int32_t sub2Pos;
  int32_t sub1Pos;
  undefined1 local_98 [8];
  UnicodeString workText;
  ParsePosition pp;
  Formattable *resVal_local;
  uint32_t nonNumericalExecutedRuleMask_local;
  double upperBound_local;
  UBool isFractionRule_local;
  ParsePosition *parsePosition_local;
  UnicodeString *text_local;
  NFRule *this_local;
  
  ParsePosition::ParsePosition((ParsePosition *)((long)&workText.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)local_98,text);
  if (this->sub1 == (NFSubstitution *)0x0) {
    local_1c8 = UnicodeString::length(&this->fRuleText);
  }
  else {
    local_1c8 = NFSubstitution::getPos(this->sub1);
  }
  if (this->sub2 == (NFSubstitution *)0x0) {
    local_1d4 = UnicodeString::length(&this->fRuleText);
  }
  else {
    local_1d4 = NFSubstitution::getPos(this->sub2);
  }
  prefix.fUnion._52_4_ = local_1d4;
  UnicodeString::UnicodeString((UnicodeString *)local_f0);
  UnicodeString::setTo((UnicodeString *)local_f0,&this->fRuleText,0,local_1c8);
  stripPrefix(this,(UnicodeString *)local_98,(UnicodeString *)local_f0,
              (ParsePosition *)((long)&workText.fUnion + 0x30));
  iVar1 = UnicodeString::length(text);
  iVar2 = UnicodeString::length((UnicodeString *)local_98);
  iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
  if ((iVar3 == 0) && (local_1c8 != 0)) {
    iVar1 = ParsePosition::getErrorIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
    ParsePosition::setErrorIndex(parsePosition,iVar1);
    Formattable::setLong(resVal,0);
  }
  else if (this->baseValue == -5) {
    iVar1 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
    ParsePosition::setIndex(parsePosition,iVar1);
    dVar7 = uprv_getInfinity_63();
    Formattable::setDouble(resVal,dVar7);
  }
  else if (this->baseValue == -6) {
    iVar1 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
    ParsePosition::setIndex(parsePosition,iVar1);
    dVar7 = uprv_getNaN_63();
    Formattable::setDouble(resVal,dVar7);
  }
  else {
    result._4_4_ = 0;
    dStack_108 = 0.0;
    tempBaseValue._4_4_ = 0;
    if (this->baseValue < 1) {
      local_238 = 0;
    }
    else {
      local_238 = this->baseValue;
    }
    temp.fUnion._48_8_ = (undefined8)local_238;
    UnicodeString::UnicodeString((UnicodeString *)&partialResult);
    do {
      ParsePosition::setIndex((ParsePosition *)((long)&workText.fUnion + 0x30),0);
      UnicodeString::setTo
                ((UnicodeString *)&partialResult,&this->fRuleText,local_1c8,
                 prefix.fUnion._52_4_ - local_1c8);
      dVar7 = matchToDelimiter(this,(UnicodeString *)local_98,tempBaseValue._4_4_,
                               (double)temp.fUnion._48_8_,(UnicodeString *)&partialResult,
                               (ParsePosition *)((long)&workText.fUnion + 0x30),this->sub1,
                               nonNumericalExecutedRuleMask,upperBound);
      iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
      if ((iVar3 == 0) && (this->sub1 != (NFSubstitution *)0x0)) {
        iVar3 = ParsePosition::getErrorIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
        iVar4 = ParsePosition::getErrorIndex(parsePosition);
        if (iVar4 < local_1c8 + iVar3) {
          ParsePosition::setErrorIndex(parsePosition,local_1c8 + iVar3);
        }
      }
      else {
        tempBaseValue._4_4_ =
             ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
        UnicodeString::UnicodeString((UnicodeString *)&pp2.index);
        iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
        iVar4 = UnicodeString::length((UnicodeString *)local_98);
        iVar5 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
        UnicodeString::setTo
                  ((UnicodeString *)&pp2.index,(UnicodeString *)local_98,iVar3,iVar4 - iVar5);
        ParsePosition::ParsePosition((ParsePosition *)&i_temp_1);
        srcStart = prefix.fUnion._52_4_;
        iVar3 = UnicodeString::length(&this->fRuleText);
        UnicodeString::setTo
                  ((UnicodeString *)&partialResult,&this->fRuleText,srcStart,
                   iVar3 - prefix.fUnion._52_4_);
        dVar7 = matchToDelimiter(this,(UnicodeString *)&pp2.index,0,dVar7,
                                 (UnicodeString *)&partialResult,(ParsePosition *)&i_temp_1,
                                 this->sub2,nonNumericalExecutedRuleMask,upperBound);
        iVar3 = ParsePosition::getIndex((ParsePosition *)&i_temp_1);
        if ((iVar3 == 0) && (this->sub2 != (NFSubstitution *)0x0)) {
          iVar3 = ParsePosition::getErrorIndex((ParsePosition *)&i_temp_1);
          iVar4 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
          ei = iVar3 + local_1c8 + iVar4;
          iVar3 = ParsePosition::getErrorIndex(parsePosition);
          if (iVar3 < ei) {
            ParsePosition::setErrorIndex(parsePosition,ei);
          }
        }
        else {
          iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
          iVar4 = ParsePosition::getIndex((ParsePosition *)&i_temp_1);
          if (result._4_4_ < (iVar1 - iVar2) + iVar3 + iVar4) {
            iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
            iVar4 = ParsePosition::getIndex((ParsePosition *)&i_temp_1);
            result._4_4_ = (iVar1 - iVar2) + iVar3 + iVar4;
            dStack_108 = dVar7;
          }
        }
        ParsePosition::~ParsePosition((ParsePosition *)&i_temp_1);
        UnicodeString::~UnicodeString((UnicodeString *)&pp2.index);
      }
      bVar6 = false;
      if (local_1c8 != prefix.fUnion._52_4_) {
        iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
        bVar6 = false;
        if (0 < iVar3) {
          iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
          iVar4 = UnicodeString::length((UnicodeString *)local_98);
          bVar6 = false;
          if (iVar3 < iVar4) {
            iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&workText.fUnion + 0x30));
            bVar6 = iVar3 != tempBaseValue._4_4_;
          }
        }
      }
    } while (bVar6);
    ParsePosition::setIndex(parsePosition,result._4_4_);
    if (0 < result._4_4_) {
      ParsePosition::setErrorIndex(parsePosition,0);
    }
    if (((isFractionRule != '\0') && (0 < result._4_4_)) && (this->sub1 == (NFSubstitution *)0x0)) {
      dStack_108 = 1.0 / dStack_108;
    }
    Formattable::setDouble(resVal,dStack_108);
    UnicodeString::~UnicodeString((UnicodeString *)&partialResult);
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_f0);
  UnicodeString::~UnicodeString((UnicodeString *)local_98);
  ParsePosition::~ParsePosition((ParsePosition *)((long)&workText.fUnion + 0x30));
  return '\x01';
}

Assistant:

UBool
NFRule::doParse(const UnicodeString& text,
                ParsePosition& parsePosition,
                UBool isFractionRule,
                double upperBound,
                uint32_t nonNumericalExecutedRuleMask,
                Formattable& resVal) const
{
    // internally we operate on a copy of the string being parsed
    // (because we're going to change it) and use our own ParsePosition
    ParsePosition pp;
    UnicodeString workText(text);

    int32_t sub1Pos = sub1 != NULL ? sub1->getPos() : fRuleText.length();
    int32_t sub2Pos = sub2 != NULL ? sub2->getPos() : fRuleText.length();

    // check to see whether the text before the first substitution
    // matches the text at the beginning of the string being
    // parsed.  If it does, strip that off the front of workText;
    // otherwise, dump out with a mismatch
    UnicodeString prefix;
    prefix.setTo(fRuleText, 0, sub1Pos);

#ifdef RBNF_DEBUG
    fprintf(stderr, "doParse %p ", this);
    {
        UnicodeString rt;
        _appendRuleText(rt);
        dumpUS(stderr, rt);
    }

    fprintf(stderr, " text: '");
    dumpUS(stderr, text);
    fprintf(stderr, "' prefix: '");
    dumpUS(stderr, prefix);
#endif
    stripPrefix(workText, prefix, pp);
    int32_t prefixLength = text.length() - workText.length();

#ifdef RBNF_DEBUG
    fprintf(stderr, "' pl: %d ppi: %d s1p: %d\n", prefixLength, pp.getIndex(), sub1Pos);
#endif

    if (pp.getIndex() == 0 && sub1Pos != 0) {
        // commented out because ParsePosition doesn't have error index in 1.1.x
        // restored for ICU4C port
        parsePosition.setErrorIndex(pp.getErrorIndex());
        resVal.setLong(0);
        return TRUE;
    }
    if (baseValue == kInfinityRule) {
        // If you match this, don't try to perform any calculations on it.
        parsePosition.setIndex(pp.getIndex());
        resVal.setDouble(uprv_getInfinity());
        return TRUE;
    }
    if (baseValue == kNaNRule) {
        // If you match this, don't try to perform any calculations on it.
        parsePosition.setIndex(pp.getIndex());
        resVal.setDouble(uprv_getNaN());
        return TRUE;
    }

    // this is the fun part.  The basic guts of the rule-matching
    // logic is matchToDelimiter(), which is called twice.  The first
    // time it searches the input string for the rule text BETWEEN
    // the substitutions and tries to match the intervening text
    // in the input string with the first substitution.  If that
    // succeeds, it then calls it again, this time to look for the
    // rule text after the second substitution and to match the
    // intervening input text against the second substitution.
    //
    // For example, say we have a rule that looks like this:
    //    first << middle >> last;
    // and input text that looks like this:
    //    first one middle two last
    // First we use stripPrefix() to match "first " in both places and
    // strip it off the front, leaving
    //    one middle two last
    // Then we use matchToDelimiter() to match " middle " and try to
    // match "one" against a substitution.  If it's successful, we now
    // have
    //    two last
    // We use matchToDelimiter() a second time to match " last" and
    // try to match "two" against a substitution.  If "two" matches
    // the substitution, we have a successful parse.
    //
    // Since it's possible in many cases to find multiple instances
    // of each of these pieces of rule text in the input string,
    // we need to try all the possible combinations of these
    // locations.  This prevents us from prematurely declaring a mismatch,
    // and makes sure we match as much input text as we can.
    int highWaterMark = 0;
    double result = 0;
    int start = 0;
    double tempBaseValue = (double)(baseValue <= 0 ? 0 : baseValue);

    UnicodeString temp;
    do {
        // our partial parse result starts out as this rule's base
        // value.  If it finds a successful match, matchToDelimiter()
        // will compose this in some way with what it gets back from
        // the substitution, giving us a new partial parse result
        pp.setIndex(0);

        temp.setTo(fRuleText, sub1Pos, sub2Pos - sub1Pos);
        double partialResult = matchToDelimiter(workText, start, tempBaseValue,
            temp, pp, sub1,
            nonNumericalExecutedRuleMask,
            upperBound);

        // if we got a successful match (or were trying to match a
        // null substitution), pp is now pointing at the first unmatched
        // character.  Take note of that, and try matchToDelimiter()
        // on the input text again
        if (pp.getIndex() != 0 || sub1 == NULL) {
            start = pp.getIndex();

            UnicodeString workText2;
            workText2.setTo(workText, pp.getIndex(), workText.length() - pp.getIndex());
            ParsePosition pp2;

            // the second matchToDelimiter() will compose our previous
            // partial result with whatever it gets back from its
            // substitution if there's a successful match, giving us
            // a real result
            temp.setTo(fRuleText, sub2Pos, fRuleText.length() - sub2Pos);
            partialResult = matchToDelimiter(workText2, 0, partialResult,
                temp, pp2, sub2,
                nonNumericalExecutedRuleMask,
                upperBound);

            // if we got a successful match on this second
            // matchToDelimiter() call, update the high-water mark
            // and result (if necessary)
            if (pp2.getIndex() != 0 || sub2 == NULL) {
                if (prefixLength + pp.getIndex() + pp2.getIndex() > highWaterMark) {
                    highWaterMark = prefixLength + pp.getIndex() + pp2.getIndex();
                    result = partialResult;
                }
            }
            else {
                // commented out because ParsePosition doesn't have error index in 1.1.x
                // restored for ICU4C port
                int32_t i_temp = pp2.getErrorIndex() + sub1Pos + pp.getIndex();
                if (i_temp> parsePosition.getErrorIndex()) {
                    parsePosition.setErrorIndex(i_temp);
                }
            }
        }
        else {
            // commented out because ParsePosition doesn't have error index in 1.1.x
            // restored for ICU4C port
            int32_t i_temp = sub1Pos + pp.getErrorIndex();
            if (i_temp > parsePosition.getErrorIndex()) {
                parsePosition.setErrorIndex(i_temp);
            }
        }
        // keep trying to match things until the outer matchToDelimiter()
        // call fails to make a match (each time, it picks up where it
        // left off the previous time)
    } while (sub1Pos != sub2Pos
        && pp.getIndex() > 0
        && pp.getIndex() < workText.length()
        && pp.getIndex() != start);

    // update the caller's ParsePosition with our high-water mark
    // (i.e., it now points at the first character this function
    // didn't match-- the ParsePosition is therefore unchanged if
    // we didn't match anything)
    parsePosition.setIndex(highWaterMark);
    // commented out because ParsePosition doesn't have error index in 1.1.x
    // restored for ICU4C port
    if (highWaterMark > 0) {
        parsePosition.setErrorIndex(0);
    }

    // this is a hack for one unusual condition: Normally, whether this
    // rule belong to a fraction rule set or not is handled by its
    // substitutions.  But if that rule HAS NO substitutions, then
    // we have to account for it here.  By definition, if the matching
    // rule in a fraction rule set has no substitutions, its numerator
    // is 1, and so the result is the reciprocal of its base value.
    if (isFractionRule && highWaterMark > 0 && sub1 == NULL) {
        result = 1 / result;
    }

    resVal.setDouble(result);
    return TRUE; // ??? do we need to worry if it is a long or a double?
}